

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O3

int run_test_poll_nested_epoll(void)

{
  long *plVar1;
  __pthread_list_t *handle;
  uv_handle_t *handle_00;
  uv_loop_t *handle_01;
  uint uVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  uint uVar5;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_loop_t *puVar6;
  connection_context_t *handle_02;
  uv_poll_t *handle_03;
  ssize_t sVar7;
  int *piVar8;
  long extraout_RAX;
  long lVar9;
  ulong uVar10;
  uint extraout_EDX;
  uv_loop_t *unaff_RBX;
  uv_handle_type uVar11;
  uv_handle_type uVar12;
  undefined1 *in_RSI;
  undefined1 *puVar13;
  sockaddr *__addr;
  uv_poll_t *puVar14;
  uv_loop_t *puVar15;
  undefined8 *puVar16;
  uv_loop_t *puVar17;
  size_t sVar18;
  uv_poll_t poll_handle;
  socklen_t sStack_ec;
  sockaddr sStack_e8;
  uv_loop_t *puStack_d8;
  undefined4 uStack_c4;
  uv_loop_t *puStack_c0;
  undefined1 *puStack_b8;
  uv_loop_t *puStack_b0;
  
  puVar13 = &stack0xffffffffffffff58;
  puVar6 = (uv_loop_t *)&stack0xffffffffffffff58;
  puVar15 = (uv_loop_t *)0x1;
  puStack_b0 = (uv_loop_t *)0x171337;
  uVar2 = epoll_create(1);
  if (uVar2 == 0xffffffff) {
    puStack_b0 = (uv_loop_t *)0x1713ff;
    run_test_poll_nested_epoll_cold_7();
LAB_001713ff:
    puVar6 = puVar15;
    puStack_b0 = (uv_loop_t *)0x171404;
    run_test_poll_nested_epoll_cold_1();
LAB_00171404:
    puStack_b0 = (uv_loop_t *)0x171409;
    run_test_poll_nested_epoll_cold_2();
LAB_00171409:
    puStack_b0 = (uv_loop_t *)0x17140e;
    run_test_poll_nested_epoll_cold_6();
LAB_0017140e:
    puStack_b0 = (uv_loop_t *)0x171413;
    run_test_poll_nested_epoll_cold_3();
LAB_00171413:
    puStack_b0 = (uv_loop_t *)0x171418;
    run_test_poll_nested_epoll_cold_4();
  }
  else {
    unaff_RBX = (uv_loop_t *)(ulong)uVar2;
    puStack_b0 = (uv_loop_t *)0x171347;
    puVar15 = uv_default_loop();
    puStack_b0 = (uv_loop_t *)0x171354;
    iVar3 = uv_poll_init(puVar15,(uv_poll_t *)&stack0xffffffffffffff58,uVar2);
    in_RSI = puVar13;
    if (iVar3 != 0) goto LAB_001713ff;
    in_RSI = (undefined1 *)0x1;
    puStack_b0 = (uv_loop_t *)0x171370;
    iVar3 = uv_poll_start((uv_poll_t *)&stack0xffffffffffffff58,1,abort);
    if (iVar3 != 0) goto LAB_00171404;
    puStack_b0 = (uv_loop_t *)0x17137d;
    puVar6 = uv_default_loop();
    in_RSI = (undefined1 *)0x2;
    puStack_b0 = (uv_loop_t *)0x17138a;
    iVar3 = uv_run(puVar6,UV_RUN_NOWAIT);
    if (iVar3 == 0) goto LAB_00171409;
    puStack_b0 = (uv_loop_t *)0x171398;
    uv_close((uv_handle_t *)&stack0xffffffffffffff58,(uv_close_cb)0x0);
    puStack_b0 = (uv_loop_t *)0x17139d;
    puVar6 = uv_default_loop();
    in_RSI = (undefined1 *)0x0;
    puStack_b0 = (uv_loop_t *)0x1713a7;
    iVar3 = uv_run(puVar6,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_0017140e;
    puVar6 = (uv_loop_t *)(ulong)uVar2;
    puStack_b0 = (uv_loop_t *)0x1713b2;
    iVar3 = close(uVar2);
    if (iVar3 != 0) goto LAB_00171413;
    puStack_b0 = (uv_loop_t *)0x1713bb;
    unaff_RBX = uv_default_loop();
    puStack_b0 = (uv_loop_t *)0x1713cf;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    in_RSI = (undefined1 *)0x0;
    puStack_b0 = (uv_loop_t *)0x1713d9;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    puStack_b0 = (uv_loop_t *)0x1713de;
    puVar6 = uv_default_loop();
    puStack_b0 = (uv_loop_t *)0x1713e6;
    iVar3 = uv_loop_close(puVar6);
    if (iVar3 == 0) {
      puStack_b0 = (uv_loop_t *)0x1713ef;
      uv_library_shutdown();
      return 0;
    }
  }
  puStack_b0 = (uv_loop_t *)create_bound_socket;
  run_test_poll_nested_epoll_cold_5();
  puVar16 = (undefined8 *)0x2;
  puStack_d8 = (uv_loop_t *)0x17143d;
  puStack_c0 = puVar6;
  puStack_b8 = in_RSI;
  puStack_b0 = unaff_RBX;
  uVar2 = socket(2,1,0);
  if ((int)uVar2 < 0) {
    puStack_d8 = (uv_loop_t *)0x17148b;
    create_bound_socket_cold_1();
LAB_0017148b:
    puStack_d8 = (uv_loop_t *)0x171490;
    create_bound_socket_cold_2();
  }
  else {
    unaff_RBX = (uv_loop_t *)(ulong)uVar2;
    uStack_c4 = 1;
    puVar16 = (undefined8 *)(ulong)uVar2;
    puStack_d8 = (uv_loop_t *)0x171465;
    iVar3 = setsockopt(uVar2,1,2,&uStack_c4,4);
    if (iVar3 != 0) goto LAB_0017148b;
    puVar16 = (undefined8 *)(ulong)uVar2;
    puStack_d8 = (uv_loop_t *)0x17147a;
    iVar3 = bind(uVar2,(sockaddr *)&puStack_c0,0x10);
    if (iVar3 == 0) {
      return uVar2;
    }
  }
  puStack_d8 = (uv_loop_t *)server_poll_cb;
  create_bound_socket_cold_3();
  handle_00 = (uv_handle_t *)*puVar16;
  sStack_ec = 0x10;
  iVar3 = *(int *)((long)&handle_00[1].u + 0x10);
  __addr = &sStack_e8;
  puStack_d8 = unaff_RBX;
  iVar4 = accept(iVar3,__addr,&sStack_ec);
  uVar11 = (uv_handle_type)__addr;
  if (iVar4 < 0) {
    server_poll_cb_cold_1();
  }
  else {
    handle_02 = create_connection_context(iVar4,1);
    handle_02->events = 7;
    uVar11 = UV_NAMED_PIPE;
    iVar4 = uv_poll_start(&handle_02->poll_handle,7,connection_poll_cb);
    iVar3 = (int)handle_02;
    if (iVar4 == 0) {
      iVar3 = *(int *)((long)&handle_00[1].u + 0x14) + 1;
      *(int *)((long)&handle_00[1].u + 0x14) = iVar3;
      if (iVar3 == 5) {
        close_socket(*(uv_os_sock_t *)((long)&handle_00[1].u + 0x10));
        uv_close(handle_00,server_close_cb);
        iVar3 = extraout_EAX;
      }
      return iVar3;
    }
  }
  server_poll_cb_cold_2();
  puVar15 = (uv_loop_t *)0x170;
  uVar12 = uVar11;
  handle_03 = (uv_poll_t *)malloc(0x170);
  if (handle_03 == (uv_poll_t *)0x0) {
    create_connection_context_cold_3();
LAB_001715bf:
    create_connection_context_cold_1();
  }
  else {
    handle_03[1].io_watcher.fd = iVar3;
    handle_03[2].type = uVar11;
    handle_03[2].data = (void *)0x0;
    handle_03[2].loop = (uv_loop_t *)0x0;
    *(undefined8 *)&handle_03[2].field_0x14 = 0;
    *(undefined8 *)((long)&handle_03[2].close_cb + 4) = 0;
    *(undefined8 *)((long)handle_03[2].handle_queue + 4) = 0;
    puVar15 = uv_default_loop();
    puVar14 = handle_03;
    iVar3 = uv_poll_init_socket(puVar15,handle_03,iVar3);
    uVar12 = (uv_handle_type)puVar14;
    *(int *)&handle_03[2].field_0x14 = *(int *)&handle_03[2].field_0x14 + 1;
    handle_03->data = handle_03;
    if (iVar3 != 0) goto LAB_001715bf;
    puVar15 = uv_default_loop();
    puVar14 = handle_03 + 1;
    iVar3 = uv_timer_init(puVar15,(uv_timer_t *)puVar14);
    uVar12 = (uv_handle_type)puVar14;
    *(int *)&handle_03[2].field_0x14 = *(int *)&handle_03[2].field_0x14 + 1;
    handle_03[1].data = handle_03;
    if (iVar3 == 0) {
      return (int)handle_03;
    }
  }
  create_connection_context_cold_2();
  puVar6 = puVar15;
  if (uVar12 == UV_UNKNOWN_HANDLE) {
    handle_01 = (uv_loop_t *)puVar15->data;
    uVar2 = *(uint *)((long)&handle_01->cloexec_lock + 0x34);
    if ((uVar2 & extraout_EDX) == 0) goto LAB_00171b65;
    if ((~uVar2 & extraout_EDX) != 0) goto LAB_00171b6a;
    if ((extraout_EDX & 1) == 0) goto switchD_00171770_caseD_4;
    iVar3 = rand();
    switch(iVar3 % 7) {
    case 0:
    case 1:
      do {
        uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
        puVar6 = (uv_loop_t *)(ulong)uVar5;
        sVar7 = recv(uVar5,connection_poll_cb::buffer,0x4a,0);
        uVar5 = (uint)sVar7;
        if (uVar5 != 0xffffffff) {
          if (-1 < (int)uVar5) {
            if (uVar5 == 0) goto LAB_001718c7;
            plVar1 = (long *)((long)&handle_01->cloexec_lock + 0x10);
            *plVar1 = *plVar1 + (ulong)(uVar5 & 0x7fffffff);
            goto switchD_00171770_caseD_4;
          }
          break;
        }
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      connection_poll_cb_cold_4();
      goto LAB_001717a7;
    case 2:
    case 3:
      do {
        while( true ) {
          uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
          puVar6 = (uv_loop_t *)(ulong)uVar5;
          sVar7 = recv(uVar5,connection_poll_cb::buffer_1,0x3a3,0);
          uVar5 = (uint)sVar7;
          if (uVar5 == 0xffffffff) break;
          if ((int)uVar5 < 1) {
            if (uVar5 == 0) goto LAB_001718c7;
            piVar8 = __errno_location();
            iVar3 = *piVar8;
            goto LAB_001718b0;
          }
          plVar1 = (long *)((long)&handle_01->cloexec_lock + 0x10);
          *plVar1 = *plVar1 + (ulong)(uVar5 & 0x7fffffff);
        }
        piVar8 = __errno_location();
        iVar3 = *piVar8;
      } while (iVar3 == 4);
LAB_001718b0:
      if ((iVar3 != 0xb) && (iVar3 != 0x73)) {
        connection_poll_cb_cold_3();
LAB_001718c7:
        *(undefined4 *)((long)&handle_01->cloexec_lock + 0x28) = 1;
        uVar2 = uVar2 & 0xfffffffe;
      }
      break;
    case 4:
      break;
    case 5:
      uVar2 = uVar2 & 0xfffffffe;
      puVar6 = (uv_loop_t *)&(handle_01->wq_mutex).__data.__list;
      puVar17 = puVar6;
      iVar3 = uv_is_active((uv_handle_t *)puVar6);
      if (iVar3 == 0) {
        *(undefined4 *)&handle_01->closing_handles = 1;
        uv_timer_start((uv_timer_t *)puVar6,delay_timer_cb,10,0);
      }
      else {
        *(byte *)&handle_01->closing_handles = *(byte *)&handle_01->closing_handles | 1;
        puVar6 = puVar17;
      }
      break;
    case 6:
      uv_poll_start((uv_poll_t *)handle_01,2,connection_poll_cb);
      puVar6 = handle_01;
      uv_poll_start((uv_poll_t *)handle_01,1,connection_poll_cb);
      *(undefined4 *)((long)&handle_01->cloexec_lock + 0x34) = 1;
      break;
    default:
      goto switchD_00171770_default;
    }
switchD_00171770_caseD_4:
    if ((extraout_EDX & 2) == 0) goto switchD_001717e8_caseD_4;
    if ((*(ulong *)((long)&handle_01->cloexec_lock + 0x18) < 0x10000) &&
       ((test_mode != '\x01' || (*(int *)((long)&handle_01->cloexec_lock + 0x20) == 0)))) {
LAB_001717a7:
      iVar3 = rand();
      switch(iVar3 % 7) {
      case 0:
      case 1:
        lVar9 = *(long *)((long)&handle_01->cloexec_lock + 0x18);
        uVar10 = -(lVar9 + -0x10000);
        sVar18 = 0x67;
        if (uVar10 < 0x67) {
          sVar18 = uVar10;
        }
        if (lVar9 != 0x10000) {
          do {
            uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
            puVar6 = (uv_loop_t *)(ulong)uVar5;
            sVar7 = send(uVar5,connection_poll_cb::buffer_2,sVar18,0);
            uVar5 = (uint)sVar7;
            if (uVar5 != 0xffffffff) {
              if (-1 < (int)uVar5) {
                if (uVar5 == 0) goto LAB_00171b97;
                plVar1 = (long *)((long)&handle_01->cloexec_lock + 0x18);
                *plVar1 = *plVar1 + (ulong)(uVar5 & 0x7fffffff);
                valid_writable_wakeups = valid_writable_wakeups + 1;
                goto switchD_001717e8_caseD_4;
              }
              piVar8 = __errno_location();
              iVar3 = *piVar8;
              break;
            }
            piVar8 = __errno_location();
            iVar3 = *piVar8;
          } while (iVar3 == 4);
          if ((iVar3 != 0xb) && (iVar3 != 0x73)) {
            connection_poll_cb_cold_13();
LAB_00171afc:
            piVar8 = __errno_location();
            iVar3 = *piVar8;
            goto LAB_00171b03;
          }
LAB_00171b11:
          spurious_writable_wakeups = spurious_writable_wakeups + 1;
          break;
        }
        goto LAB_00171b83;
      case 2:
      case 3:
        lVar9 = *(long *)((long)&handle_01->cloexec_lock + 0x18);
        sVar18 = -(lVar9 + -0x10000);
        if (0x4d1 < sVar18) {
          sVar18 = 0x4d2;
        }
        if (lVar9 == 0x10000) goto LAB_00171b88;
        do {
          uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
          puVar6 = (uv_loop_t *)(ulong)uVar5;
          sVar7 = send(uVar5,connection_poll_cb::buffer_3,sVar18,0);
          uVar5 = (uint)sVar7;
          if (uVar5 != 0xffffffff) {
            if ((int)uVar5 < 0) goto LAB_00171afc;
            if (uVar5 == 0) goto LAB_00171b9c;
            valid_writable_wakeups = valid_writable_wakeups + 1;
            uVar10 = *(long *)((long)&handle_01->cloexec_lock + 0x18) + (ulong)(uVar5 & 0x7fffffff);
            *(ulong *)((long)&handle_01->cloexec_lock + 0x18) = uVar10;
            goto joined_r0x00171a0a;
          }
          piVar8 = __errno_location();
          iVar3 = *piVar8;
        } while (iVar3 == 4);
LAB_00171b03:
        if ((iVar3 == 0xb) || (iVar3 == 0x73)) goto LAB_00171b11;
        goto LAB_00171b92;
      case 4:
        break;
      case 5:
        uVar2 = uVar2 & 0xfffffffd;
        handle = &(handle_01->wq_mutex).__data.__list;
        iVar3 = uv_is_active((uv_handle_t *)handle);
        if (iVar3 == 0) {
          *(undefined4 *)&handle_01->closing_handles = 2;
          uv_timer_start((uv_timer_t *)handle,delay_timer_cb,100,0);
        }
        else {
          *(byte *)&handle_01->closing_handles = *(byte *)&handle_01->closing_handles | 2;
        }
        break;
      case 6:
        uv_poll_start((uv_poll_t *)handle_01,1,connection_poll_cb);
        uv_poll_start((uv_poll_t *)handle_01,2,connection_poll_cb);
        *(undefined4 *)((long)&handle_01->cloexec_lock + 0x34) = 2;
        break;
      default:
        goto switchD_001717e8_default;
      }
switchD_001717e8_caseD_4:
      if ((extraout_EDX & 4) != 0) {
        (handle_01->cloexec_lock).__data.__flags = 1;
        disconnects = disconnects + 1;
        uVar2 = uVar2 & 0xfffffffb;
      }
      if (((*(int *)((long)&handle_01->cloexec_lock + 0x28) == 0) ||
          (*(int *)((long)&handle_01->cloexec_lock + 0x2c) == 0)) ||
         ((handle_01->cloexec_lock).__data.__flags == 0)) {
        if (uVar2 != *(uint *)((long)&handle_01->cloexec_lock + 0x34)) {
          *(uint *)((long)&handle_01->cloexec_lock + 0x34) = uVar2;
          uv_poll_start((uv_poll_t *)puVar15,uVar2,connection_poll_cb);
          uVar2 = *(uint *)((long)&handle_01->cloexec_lock + 0x34);
        }
        if (uVar2 != 0) {
          iVar3 = uv_is_active((uv_handle_t *)puVar15);
          if (iVar3 == 1) {
            return 1;
          }
          connection_poll_cb_cold_16();
        }
      }
      else {
        close_socket((handle_01->cloexec_lock).__data.__wrphase_futex);
        uv_close((uv_handle_t *)handle_01,connection_close_cb);
        uv_close((uv_handle_t *)&(handle_01->wq_mutex).__data.__list,connection_close_cb);
        *(undefined4 *)((long)&handle_01->cloexec_lock + 0x34) = 0;
      }
      iVar3 = uv_is_active((uv_handle_t *)puVar15);
      if (iVar3 == 0) {
        return 0;
      }
      goto LAB_00171b6f;
    }
    uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
    puVar6 = (uv_loop_t *)(ulong)uVar5;
    iVar3 = shutdown(uVar5,1);
    if (iVar3 == 0) {
      *(undefined4 *)((long)&handle_01->cloexec_lock + 0x2c) = 1;
      uVar2 = uVar2 & 0xfffffffd;
      goto switchD_001717e8_caseD_4;
    }
  }
  else {
LAB_00171b60:
    connection_poll_cb_cold_1();
    puVar15 = puVar6;
LAB_00171b65:
    connection_poll_cb_cold_18();
LAB_00171b6a:
    connection_poll_cb_cold_2();
LAB_00171b6f:
    connection_poll_cb_cold_17();
    puVar6 = puVar15;
  }
  connection_poll_cb_cold_6();
LAB_00171b79:
  connection_poll_cb_cold_7();
switchD_00171770_default:
  connection_poll_cb_cold_5();
LAB_00171b83:
  connection_poll_cb_cold_14();
LAB_00171b88:
  connection_poll_cb_cold_11();
switchD_001717e8_default:
  connection_poll_cb_cold_15();
LAB_00171b92:
  connection_poll_cb_cold_10();
LAB_00171b97:
  connection_poll_cb_cold_12();
LAB_00171b9c:
  connection_poll_cb_cold_9();
  iVar3 = close((int)puVar6);
  if ((iVar3 == 0) || (piVar8 = __errno_location(), *piVar8 == 0x68)) {
    return extraout_EAX_00;
  }
  close_socket_cold_1();
  puVar15 = (uv_loop_t *)puVar6->data;
  iVar3 = uv_is_active((uv_handle_t *)puVar6);
  if (iVar3 == 0) {
    if (*(uint *)&puVar15->closing_handles == 0) goto LAB_00171c03;
    uVar2 = *(uint *)&puVar15->closing_handles | *(uint *)((long)&puVar15->cloexec_lock + 0x34);
    *(uint *)((long)&puVar15->cloexec_lock + 0x34) = uVar2;
    *(undefined4 *)&puVar15->closing_handles = 0;
    iVar3 = uv_poll_start((uv_poll_t *)puVar15,uVar2,connection_poll_cb);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    delay_timer_cb_cold_1();
LAB_00171c03:
    puVar15 = puVar6;
    delay_timer_cb_cold_3();
  }
  delay_timer_cb_cold_2();
  puVar16 = (undefined8 *)puVar15->data;
  piVar8 = (int *)((long)puVar16 + 0x154);
  *piVar8 = *piVar8 + -1;
  if (*piVar8 != 0) {
    return extraout_EAX_01;
  }
  if (test_mode == '\x01') {
    lVar9 = puVar16[0x28];
    if (*(int *)(puVar16 + 0x2a) != 0) {
      if (lVar9 == 0x10000) {
        if (puVar16[0x29] == 0) goto LAB_00171c6f;
        connection_close_cb_cold_2();
        goto LAB_00171c4b;
      }
      goto LAB_00171c58;
    }
LAB_00171c5d:
    if (lVar9 != 0) goto LAB_00171c80;
  }
  else {
LAB_00171c4b:
    if (puVar16[0x28] != 0x10000) {
LAB_00171c58:
      connection_close_cb_cold_1();
      lVar9 = extraout_RAX;
      goto LAB_00171c5d;
    }
  }
  if (puVar16[0x29] == 0x10000) {
LAB_00171c6f:
    closed_connections = closed_connections + 1;
    free(puVar16);
    return extraout_EAX_02;
  }
  connection_close_cb_cold_4();
LAB_00171c80:
  connection_close_cb_cold_3();
  free((void *)*puVar16);
  return extraout_EAX_03;
joined_r0x00171a0a:
  if (0xffff < uVar10) goto switchD_001717e8_caseD_4;
  sVar18 = 0x10000 - uVar10;
  if (uVar10 < 0xfb2f) {
    sVar18 = 0x4d2;
  }
  while( true ) {
    uVar5 = (handle_01->cloexec_lock).__data.__wrphase_futex;
    puVar6 = (uv_loop_t *)(ulong)uVar5;
    sVar7 = send(uVar5,connection_poll_cb::buffer_3,sVar18,0);
    uVar5 = (uint)sVar7;
    if (uVar5 != 0xffffffff) break;
    piVar8 = __errno_location();
    iVar3 = *piVar8;
    if (iVar3 != 4) goto LAB_00171b49;
  }
  if (uVar5 == 0) goto LAB_00171b79;
  if ((int)uVar5 < 0) {
    piVar8 = __errno_location();
    iVar3 = *piVar8;
LAB_00171b49:
    if ((iVar3 != 0xb) && (iVar3 != 0x73)) {
      connection_poll_cb_cold_8();
      goto LAB_00171b60;
    }
    goto switchD_001717e8_caseD_4;
  }
  uVar10 = *(long *)((long)&handle_01->cloexec_lock + 0x18) + (ulong)(uVar5 & 0x7fffffff);
  *(ulong *)((long)&handle_01->cloexec_lock + 0x18) = uVar10;
  goto joined_r0x00171a0a;
}

Assistant:

TEST_IMPL(poll_nested_epoll) {
  uv_poll_t poll_handle;
  int fd;

  fd = epoll_create(1);
  ASSERT(fd != -1);

  ASSERT(0 == uv_poll_init(uv_default_loop(), &poll_handle, fd));
  ASSERT(0 == uv_poll_start(&poll_handle, UV_READABLE, (uv_poll_cb) abort));
  ASSERT(0 != uv_run(uv_default_loop(), UV_RUN_NOWAIT));

  uv_close((uv_handle_t*) &poll_handle, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == close(fd));

  MAKE_VALGRIND_HAPPY();
  return 0;
}